

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureFilteringTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeFilteringTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeFilteringTestInstance *this)

{
  ostringstream *this_00;
  ostringstream *this_01;
  ostringstream *this_02;
  FilterMode FVar1;
  FilterMode FVar2;
  TestLog *pTVar3;
  TestContext *pTVar4;
  TextureCubeFilteringTestInstance *pTVar5;
  TextureRenderer *this_03;
  bool bVar6;
  int i;
  int iVar7;
  deUint32 width;
  deUint32 height;
  undefined4 extraout_var;
  pointer pFVar8;
  size_t sVar9;
  long lVar10;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int iVar11;
  CubeFace face;
  void *pvVar12;
  char *__s;
  PixelFormat pixelFormat;
  Surface rendered;
  vector<float,_std::allocator<float>_> texCoord;
  LodPrecision lodPrecision;
  LookupPrecision local_34c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_320;
  string *local_318;
  TextureCubeFilteringTestInstance *local_310;
  TestTextureCube *local_308;
  TextureRenderer *local_300;
  IVec4 formatBitDepth;
  ConstPixelBufferAccess local_2d8;
  IVec4 colorBits;
  Vector<int,_4> res;
  ConstPixelBufferAccess *local_288;
  ConstPixelBufferAccess *pCStack_280;
  ConstPixelBufferAccess *local_278;
  undefined4 uStack_270;
  undefined4 uStack_26c;
  undefined4 uStack_268;
  undefined4 uStack_264;
  DepthStencilMode DStack_260;
  ios_base local_220 [272];
  TextureFormat texFmt;
  ReferenceParams refParams;
  TextureFormatInfo fmtInfo;
  
  pTVar3 = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  local_300 = &this->m_renderer;
  local_308 = util::TextureRenderer::getCubeTexture
                        (local_300,
                         (this->m_cases).
                         super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
                         ._M_impl.super__Vector_impl_data._M_start[this->m_caseNdx].textureIndex);
  iVar7 = (*(local_308->super_TestTexture)._vptr_TestTexture[0xe])();
  texFmt = *(TextureFormat *)CONCAT44(extraout_var,iVar7);
  tcu::getTextureFormatInfo(&fmtInfo,&texFmt);
  pFVar8 = (this->m_cases).
           super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
           ._M_impl.super__Vector_impl_data._M_start + this->m_caseNdx;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams(&refParams,TEXTURETYPE_CUBE);
  local_310 = this;
  util::createSampler((Sampler *)&res,CLAMP_TO_EDGE,CLAMP_TO_EDGE,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  refParams.sampler._16_8_ = local_288;
  refParams.sampler._24_8_ = pCStack_280;
  refParams.sampler.wrapS = res.m_data[0];
  refParams.sampler.wrapT = res.m_data[1];
  refParams.sampler.wrapR = res.m_data[2];
  refParams.sampler.minFilter = res.m_data[3];
  refParams.sampler._32_8_ = local_278;
  refParams.sampler.borderColor.v.uData[1] = uStack_270;
  refParams.sampler._53_7_ = SUB87(CONCAT44(DStack_260,uStack_264) >> 8,0);
  refParams.sampler.seamlessCubeMap = true;
  refParams.super_RenderParams.samplerType = glu::TextureTestUtil::getSamplerType(texFmt);
  refParams.lodMode = LODMODE_EXACT;
  refParams.super_RenderParams.colorBias.m_data[0] = fmtInfo.lookupBias.m_data[0];
  refParams.super_RenderParams.colorBias.m_data[1] = fmtInfo.lookupBias.m_data[1];
  refParams.super_RenderParams.colorBias.m_data[2] = fmtInfo.lookupBias.m_data[2];
  refParams.super_RenderParams.colorBias.m_data[3] = fmtInfo.lookupBias.m_data[3];
  refParams.super_RenderParams.colorScale.m_data[0] = fmtInfo.lookupScale.m_data[0];
  refParams.super_RenderParams.colorScale.m_data[1] = fmtInfo.lookupScale.m_data[1];
  refParams.super_RenderParams.colorScale.m_data[2] = fmtInfo.lookupScale.m_data[2];
  refParams.super_RenderParams.colorScale.m_data[3] = fmtInfo.lookupScale.m_data[3];
  this_00 = (ostringstream *)(res.m_data + 2);
  res.m_data._0_8_ = pTVar3;
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Coordinates: ",0xd);
  tcu::operator<<((ostream *)this_00,&pFVar8->bottomLeft);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," -> ",4);
  tcu::operator<<((ostream *)this_00,&pFVar8->topRight);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base(local_220);
  this_01 = (ostringstream *)(res.m_data + 2);
  local_318 = (string *)&__return_storage_ptr__->m_description;
  local_320 = &(__return_storage_ptr__->m_description).field_2;
  face = CUBEFACE_NEGATIVE_X;
  do {
    this_03 = local_300;
    width = util::TextureRenderer::getRenderWidth(local_300);
    height = util::TextureRenderer::getRenderHeight(this_03);
    tcu::Surface::Surface(&rendered,width,height);
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    glu::TextureTestUtil::computeQuadTexCoordCube
              (&texCoord,face,&pFVar8->bottomLeft,&pFVar8->topRight);
    pTVar5 = local_310;
    res.m_data._0_8_ = pTVar3;
    std::__cxx11::ostringstream::ostringstream(this_00);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"Face ",5);
    switch(face) {
    case CUBEFACE_NEGATIVE_X:
      bVar6 = false;
      __s = "-X";
      break;
    case CUBEFACE_POSITIVE_X:
      bVar6 = false;
      __s = "+X";
      break;
    case CUBEFACE_NEGATIVE_Y:
      bVar6 = false;
      __s = "-Y";
      break;
    case CUBEFACE_POSITIVE_Y:
      bVar6 = false;
      __s = "+Y";
      break;
    case CUBEFACE_NEGATIVE_Z:
      bVar6 = false;
      __s = "-Z";
      break;
    case CUBEFACE_POSITIVE_Z:
      bVar6 = false;
      __s = "+Z";
      break;
    default:
      bVar6 = true;
      __s = (char *)0x0;
    }
    if (bVar6) {
      std::ios::clear((int)this_00 + (int)*(undefined8 *)(res.m_data._8_8_ + -0x18));
    }
    else {
      sVar9 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,__s,sVar9);
    }
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_220);
    util::TextureRenderer::renderQuad
              (local_300,&rendered,pFVar8->textureIndex,
               texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start,&refParams);
    FVar1 = (pTVar5->m_testParameters).super_TextureCubeTestCaseParameters.
            super_TextureCommonTestCaseParameters.magFilter;
    FVar2 = (pTVar5->m_testParameters).super_TextureCubeTestCaseParameters.
            super_TextureCommonTestCaseParameters.minFilter;
    res.m_data._0_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
    tcu::getTextureFormatBitDepth((tcu *)&formatBitDepth,(TextureFormat *)&res);
    pixelFormat.redBits = formatBitDepth.m_data[0];
    pixelFormat.greenBits = formatBitDepth.m_data[1];
    pixelFormat.blueBits = formatBitDepth.m_data[2];
    pixelFormat.alphaBits = formatBitDepth.m_data[3];
    local_34c.coordBits.m_data[2] = formatBitDepth.m_data[2];
    local_34c.uvwBits.m_data[0] = formatBitDepth.m_data[3];
    res.m_data[0] = 0;
    res.m_data[1] = 0;
    res.m_data[2] = 0;
    res.m_data[3] = 0;
    lVar10 = 0;
    do {
      res.m_data[lVar10] =
           local_34c.coordBits.m_data[lVar10] +
           ((FVar1 == NEAREST && FVar2 == NEAREST) | 0xfffffffe);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    local_2d8.m_format.order = R;
    local_2d8.m_format.type = SNORM_INT8;
    local_2d8.m_size.m_data[0] = 0;
    local_2d8.m_size.m_data[1] = 0;
    colorBits.m_data[0] = 0;
    colorBits.m_data[1] = 0;
    colorBits.m_data[2] = 0;
    colorBits.m_data[3] = 0;
    lVar10 = 0;
    do {
      iVar7 = local_2d8.m_size.m_data[lVar10 + -2];
      if (iVar7 < res.m_data[lVar10]) {
        iVar7 = res.m_data[lVar10];
      }
      colorBits.m_data[lVar10] = iVar7;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    lodPrecision.rule = RULE_VULKAN;
    lVar10 = 0;
    do {
      local_34c.coordBits.m_data[lVar10] = 0x16;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 3);
    lVar10 = 3;
    do {
      local_34c.coordBits.m_data[lVar10] = 0x10;
      lVar10 = lVar10 + 1;
    } while (lVar10 != 6);
    local_34c.colorThreshold.m_data[0] = 0.0;
    local_34c.colorThreshold.m_data[1] = 0.0;
    local_34c.colorThreshold.m_data[2] = 0.0;
    local_34c.colorThreshold.m_data[3] = 0.0;
    local_34c.colorMask.m_data[0] = true;
    local_34c.colorMask.m_data[1] = true;
    local_34c.colorMask.m_data[2] = true;
    local_34c.colorMask.m_data[3] = true;
    lodPrecision.derivateBits = 10;
    lodPrecision.lodBits = 5;
    tcu::computeFixedPointThreshold((tcu *)&local_2d8,&colorBits);
    res.m_data[0] = 0;
    res.m_data[1] = 0;
    res.m_data[2] = 0;
    res.m_data[3] = 0;
    lVar10 = 0;
    do {
      res.m_data[lVar10] =
           (int)((float)local_2d8.m_size.m_data[lVar10 + -2] /
                refParams.super_RenderParams.colorScale.m_data[lVar10]);
      lVar10 = lVar10 + 1;
    } while (lVar10 != 4);
    local_34c.colorThreshold.m_data[0] = (float)res.m_data[0];
    local_34c.colorThreshold.m_data[1] = (float)res.m_data[1];
    local_34c.colorThreshold.m_data[2] = (float)res.m_data[2];
    local_34c.colorThreshold.m_data[3] = (float)res.m_data[3];
    local_34c.coordBits.m_data[0] = 10;
    local_34c.coordBits.m_data[1] = 10;
    local_34c.coordBits.m_data[2] = 10;
    local_34c.uvwBits.m_data[0] = 6;
    local_34c.uvwBits.m_data[1] = 6;
    local_34c.uvwBits.m_data[2] = 0;
    local_34c.colorMask.m_data[1] = 0 < pixelFormat.greenBits;
    local_34c.colorMask.m_data[0] = 0 < pixelFormat.redBits;
    local_34c.colorMask.m_data[2] = 0 < pixelFormat.blueBits;
    local_34c.colorMask.m_data[3] = 0 < pixelFormat.alphaBits;
    pTVar4 = ((pTVar5->super_TestInstance).m_context)->m_testCtx;
    res.m_data[0] = 8;
    res.m_data[1] = 3;
    pvVar12 = (void *)rendered.m_pixels.m_cap;
    if (rendered.m_pixels.m_cap != 0) {
      pvVar12 = rendered.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_2d8,(TextureFormat *)&res,rendered.m_width,
               rendered.m_height,1,pvVar12);
    iVar7 = (*(local_308->super_TestTexture)._vptr_TestTexture[0x10])();
    lVar10 = CONCAT44(extraout_var_00,iVar7);
    uStack_268 = (undefined4)*(undefined8 *)(lVar10 + 0x160);
    uStack_264 = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x160) >> 0x20);
    res.m_data._0_8_ = *(undefined8 *)(lVar10 + 0x130);
    res.m_data._8_8_ = *(undefined8 *)(lVar10 + 0x138);
    local_288 = *(ConstPixelBufferAccess **)(lVar10 + 0x140);
    pCStack_280 = *(ConstPixelBufferAccess **)(lVar10 + 0x148);
    local_278 = *(ConstPixelBufferAccess **)(lVar10 + 0x150);
    uStack_270 = (undefined4)*(undefined8 *)(lVar10 + 0x158);
    uStack_26c = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x158) >> 0x20);
    bVar6 = glu::TextureTestUtil::verifyTextureResult
                      (pTVar4,&local_2d8,(TextureCubeView *)&res,
                       texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start,&refParams,&local_34c,&lodPrecision,
                       &pixelFormat);
    if (!bVar6) {
      lodPrecision.lodBits = 4;
      local_34c.uvwBits.m_data[0] = 4;
      local_34c.uvwBits.m_data[1] = 4;
      local_34c.uvwBits.m_data[2] = 0;
      this_02 = (ostringstream *)(res.m_data + 2);
      res.m_data._0_8_ = pTVar3;
      std::__cxx11::ostringstream::ostringstream(this_02);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_02,
                 "Warning: Verification against high precision requirements failed, trying with lower requirements."
                 ,0x61);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(this_02);
      std::ios_base::~ios_base(local_220);
      pTVar4 = ((pTVar5->super_TestInstance).m_context)->m_testCtx;
      res.m_data[0] = 8;
      res.m_data[1] = 3;
      pvVar12 = (void *)rendered.m_pixels.m_cap;
      if (rendered.m_pixels.m_cap != 0) {
        pvVar12 = rendered.m_pixels.m_ptr;
      }
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)&local_2d8,(TextureFormat *)&res,rendered.m_width,
                 rendered.m_height,1,pvVar12);
      iVar7 = (*(local_308->super_TestTexture)._vptr_TestTexture[0x10])();
      lVar10 = CONCAT44(extraout_var_01,iVar7);
      uStack_268 = (undefined4)*(undefined8 *)(lVar10 + 0x160);
      uStack_264 = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x160) >> 0x20);
      res.m_data._0_8_ = *(undefined8 *)(lVar10 + 0x130);
      res.m_data._8_8_ = *(undefined8 *)(lVar10 + 0x138);
      local_288 = *(ConstPixelBufferAccess **)(lVar10 + 0x140);
      pCStack_280 = *(ConstPixelBufferAccess **)(lVar10 + 0x148);
      local_278 = *(ConstPixelBufferAccess **)(lVar10 + 0x150);
      uStack_270 = (undefined4)*(undefined8 *)(lVar10 + 0x158);
      uStack_26c = (undefined4)((ulong)*(undefined8 *)(lVar10 + 0x158) >> 0x20);
      bVar6 = glu::TextureTestUtil::verifyTextureResult
                        (pTVar4,&local_2d8,(TextureCubeView *)&res,
                         texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_start,&refParams,&local_34c,&lodPrecision,
                         &pixelFormat);
      if (!bVar6) {
        res.m_data._0_8_ = pTVar3;
        std::__cxx11::ostringstream::ostringstream(this_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)this_01,
                   "ERROR: Verification against low precision requirements failed, failing test case."
                   ,0x51);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)&res,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream(this_01);
        std::ios_base::~ios_base(local_220);
        res.m_data._0_8_ = &local_288;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&res,"Image verification failed","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_320;
        std::__cxx11::string::_M_construct<char*>
                  (local_318,res.m_data._0_8_,res.m_data._8_8_ + res.m_data._0_8_);
        if ((ConstPixelBufferAccess **)res.m_data._0_8_ != &local_288) {
          operator_delete((void *)res.m_data._0_8_,(ulong)((long)&(local_288->m_format).order + 1));
        }
        if (!bVar6) {
          if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_end_of_storage -
                            (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                  .super__Vector_impl_data._M_start);
          }
          tcu::Surface::~Surface(&rendered);
          return __return_storage_ptr__;
        }
      }
    }
    if (texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    tcu::Surface::~Surface(&rendered);
    face = face + CUBEFACE_POSITIVE_X;
    if (face == CUBEFACE_LAST) {
      iVar11 = local_310->m_caseNdx + 1;
      local_310->m_caseNdx = iVar11;
      iVar7 = (int)((ulong)((long)(local_310->m_cases).
                                  super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)(local_310->m_cases).
                                 super__Vector_base<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase,_std::allocator<vkt::texture::(anonymous_namespace)::TextureCubeFilteringTestInstance::FilterCase>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 2);
      if (SBORROW4(iVar11,iVar7 * -0x33333333) == iVar11 + iVar7 * 0x33333333 < 0) {
        res.m_data._0_8_ = &local_288;
        std::__cxx11::string::_M_construct<char_const*>((string *)&res,"Pass","");
        __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
        (__return_storage_ptr__->m_description)._M_dataplus._M_p = (pointer)local_320;
        std::__cxx11::string::_M_construct<char*>
                  (local_318,res.m_data._0_8_,res.m_data._8_8_ + res.m_data._0_8_);
      }
      else {
        tcu::TestStatus::incomplete();
      }
      if ((SBORROW4(iVar11,iVar7 * -0x33333333) == iVar11 + iVar7 * 0x33333333 < 0) &&
         ((ConstPixelBufferAccess **)res.m_data._0_8_ != &local_288)) {
        operator_delete((void *)res.m_data._0_8_,(ulong)((long)&(local_288->m_format).order + 1));
      }
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

tcu::TestStatus TextureCubeFilteringTestInstance::iterate (void)
{
	tcu::TestLog&						log			= m_context.getTestContext().getLog();

	const pipeline::TestTextureCube&	texture		= m_renderer.getCubeTexture(m_cases[m_caseNdx].textureIndex);
	const tcu::TextureFormat			texFmt		= texture.getTextureFormat();
	const tcu::TextureFormatInfo		fmtInfo		= tcu::getTextureFormatInfo(texFmt);
	const FilterCase&					curCase		= m_cases[m_caseNdx];
	ReferenceParams						refParams	(TEXTURETYPE_CUBE);

	// Params for reference computation.
	refParams.sampler					= util::createSampler(Sampler::CLAMP_TO_EDGE, Sampler::CLAMP_TO_EDGE, m_testParameters.minFilter, m_testParameters.magFilter);
	refParams.sampler.seamlessCubeMap	= true;
	refParams.samplerType				= getSamplerType(texFmt);
	refParams.lodMode					= LODMODE_EXACT;
	refParams.colorBias					= fmtInfo.lookupBias;
	refParams.colorScale				= fmtInfo.lookupScale;

	log << TestLog::Message << "Coordinates: " << curCase.bottomLeft << " -> " << curCase.topRight << TestLog::EndMessage;

	for (int faceNdx = 0; faceNdx < tcu::CUBEFACE_LAST; faceNdx++)
	{
		const tcu::CubeFace		face		= tcu::CubeFace(faceNdx);
		tcu::Surface			rendered	(m_renderer.getRenderWidth(), m_renderer.getRenderHeight());
		vector<float>			texCoord;

		computeQuadTexCoordCube(texCoord, face, curCase.bottomLeft, curCase.topRight);

		log << TestLog::Message << "Face " << getFaceDesc(face) << TestLog::EndMessage;

		// \todo Log texture coordinates.

		m_renderer.renderQuad(rendered, curCase.textureIndex, &texCoord[0], refParams);

		{
			const bool				isNearestOnly	= m_testParameters.minFilter == Sampler::NEAREST && m_testParameters.magFilter == Sampler::NEAREST;
			const tcu::IVec4		formatBitDepth	= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
			const tcu::PixelFormat	pixelFormat		(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
			const tcu::IVec4		colorBits		= max(getBitsVec(pixelFormat) - (isNearestOnly ? 1 : 2), tcu::IVec4(0)); // 1 inaccurate bit if nearest only, 2 otherwise
			tcu::LodPrecision		lodPrecision	(tcu::LodPrecision::RULE_VULKAN);
			tcu::LookupPrecision	lookupPrecision;

			lodPrecision.derivateBits		= 10;
			lodPrecision.lodBits			= 5;
			lookupPrecision.colorThreshold	= tcu::computeFixedPointThreshold(colorBits) / refParams.colorScale;
			lookupPrecision.coordBits		= tcu::IVec3(10,10,10);
			lookupPrecision.uvwBits			= tcu::IVec3(6,6,0);
			lookupPrecision.colorMask		= getCompareMask(pixelFormat);

			const bool isHighQuality = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::TextureCubeView)texture.getTexture(),
														   &texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

			if (!isHighQuality)
			{
				// Evaluate against lower precision requirements.
				lodPrecision.lodBits	= 4;
				lookupPrecision.uvwBits	= tcu::IVec3(4,4,0);

				log << TestLog::Message << "Warning: Verification against high precision requirements failed, trying with lower requirements." << TestLog::EndMessage;

				const bool isOk = verifyTextureResult(m_context.getTestContext(), rendered.getAccess(), (tcu::TextureCubeView)texture.getTexture(),
													  &texCoord[0], refParams, lookupPrecision, lodPrecision, pixelFormat);

				if (!isOk)
				{
					log << TestLog::Message << "ERROR: Verification against low precision requirements failed, failing test case." << TestLog::EndMessage;
					return tcu::TestStatus::fail("Image verification failed");
				}
			}
		}
	}

	m_caseNdx += 1;
	return m_caseNdx < (int)m_cases.size() ? tcu::TestStatus::incomplete() : tcu::TestStatus::pass("Pass");
}